

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O2

void __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solve2right4update
          (SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *x,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *y,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *b,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *rhs)

{
  int *piVar1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar2;
  pointer pnVar3;
  int *piVar4;
  pointer pnVar5;
  Real val;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps2_00;
  undefined1 auVar6 [56];
  int iVar7;
  ulong uVar8;
  long lVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  uint *puVar13;
  byte bVar14;
  undefined4 in_stack_fffffffffffffcd4;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  int *ridx;
  int *piVar15;
  undefined8 in_stack_fffffffffffffd30;
  undefined4 uStack_2c8;
  int f;
  Tolerances *in_stack_fffffffffffffd40;
  int in_stack_fffffffffffffd48;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  uint local_230 [28];
  int local_1c0;
  undefined1 local_1bc;
  fpclass_type local_1b8;
  int32_t local_1b4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  uint local_130 [28];
  int local_c0;
  undefined1 local_bc;
  fpclass_type local_b8;
  int32_t local_b4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar14 = 0;
  (*this->solveTime->_vptr_Timer[3])();
  ridx = (this->ssvec).super_IdxSet.idx;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  uVar8 = (ulong)(uint)(rhs->super_IdxSet).num;
  rhs->setupStatus = false;
  piVar15 = (rhs->super_IdxSet).idx;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)
             &stack0xfffffffffffffd40,
             &(this->
              super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  val = Tolerances::epsilon(in_stack_fffffffffffffd40);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&epsilon.m_backend,val,(type *)0x0);
  this_00 = &this->
             super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffd48);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(x);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(y);
  this->usetup = true;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               *)&this->ssvec,b);
  if ((this->
      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).l.updateType == 0) {
    iVar7 = (this->ssvec).super_IdxSet.num;
    pnVar10 = &epsilon;
    pnVar12 = &local_b0;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar12->m_backend).data._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
      pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar10 + ((ulong)bVar14 * -2 + 1) * 4);
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + ((ulong)bVar14 * -2 + 1) * 4);
    }
    local_b0.m_backend.exp = epsilon.m_backend.exp;
    local_b0.m_backend.neg = epsilon.m_backend.neg;
    local_b0.m_backend.fpclass = epsilon.m_backend.fpclass;
    local_b0.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    piVar1 = (x->super_IdxSet).idx;
    pnVar10 = (x->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    x->setupStatus = false;
    pnVar12 = (this->ssvec).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar2 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar11 = &epsilon;
    puVar13 = local_130;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      *puVar13 = (pnVar11->m_backend).data._M_elems[0];
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + ((ulong)bVar14 * -2 + 1) * 4);
      puVar13 = puVar13 + (ulong)bVar14 * -2 + 1;
    }
    local_c0 = epsilon.m_backend.exp;
    local_bc = epsilon.m_backend.neg;
    local_b8 = epsilon.m_backend.fpclass;
    local_b4 = epsilon.m_backend.prec_elem;
    rhs->setupStatus = false;
    auVar6 = ZEXT3256(CONCAT428(in_stack_fffffffffffffcd4,
                                CONCAT424((int)uVar8,
                                          CONCAT816(piVar15,CONCAT88((rhs->
                                                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  ).val.
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  local_130)))));
    eps2_00.m_backend.data._M_elems[0xe] = 0x1c;
    eps2_00.m_backend.data._M_elems[0xf] = 0;
    eps2_00.m_backend.data._M_elems[0] = auVar6._0_4_;
    eps2_00.m_backend.data._M_elems[1] = auVar6._4_4_;
    eps2_00.m_backend.data._M_elems[2] = auVar6._8_4_;
    eps2_00.m_backend.data._M_elems[3] = auVar6._12_4_;
    eps2_00.m_backend.data._M_elems[4] = auVar6._16_4_;
    eps2_00.m_backend.data._M_elems[5] = auVar6._20_4_;
    eps2_00.m_backend.data._M_elems[6] = auVar6._24_4_;
    eps2_00.m_backend.data._M_elems[7] = auVar6._28_4_;
    eps2_00.m_backend.data._M_elems[8] = auVar6._32_4_;
    eps2_00.m_backend.data._M_elems[9] = auVar6._36_4_;
    eps2_00.m_backend.data._M_elems[10] = auVar6._40_4_;
    eps2_00.m_backend.data._M_elems[0xb] = auVar6._44_4_;
    eps2_00.m_backend.data._M_elems[0xc] = auVar6._48_4_;
    eps2_00.m_backend.data._M_elems[0xd] = auVar6._52_4_;
    eps2_00.m_backend.data._M_elems[0x10] = iVar7;
    eps2_00.m_backend.data._M_elems[0x11] = (int)((ulong)b >> 0x20);
    eps2_00.m_backend.data._M_elems._72_8_ = pnVar10;
    eps2_00.m_backend.data._M_elems._80_8_ = piVar1;
    eps2_00.m_backend.data._M_elems._88_8_ = this_00;
    eps2_00.m_backend.data._M_elems._96_8_ = ridx;
    eps2_00.m_backend.data._M_elems[0x1a] = (int)uVar8;
    eps2_00.m_backend.data._M_elems[0x1b] = (int)(uVar8 >> 0x20);
    eps2_00.m_backend._112_8_ = piVar15;
    eps2_00.m_backend.fpclass = (int)in_stack_fffffffffffffd30;
    eps2_00.m_backend.prec_elem = (int)((ulong)in_stack_fffffffffffffd30 >> 0x20);
    iVar7 = CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::vSolveRight4update2
                      (this_00,&local_b0,pnVar10,piVar1,pnVar12,ridx,iVar7,pnVar2,eps2_00,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(f,uStack_2c8),(int *)in_stack_fffffffffffffd40,
                       in_stack_fffffffffffffd48,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)epsilon.m_backend.data._M_elems._0_8_,
                       (int *)epsilon.m_backend.data._M_elems._8_8_,
                       (int *)epsilon.m_backend.data._M_elems._16_8_);
    (x->super_IdxSet).num = iVar7;
    x->setupStatus = false;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::
    setup_and_assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)&this->eta,x);
  }
  else {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear(&this->forest);
    iVar7 = (this->ssvec).super_IdxSet.num;
    pnVar10 = &epsilon;
    pnVar12 = &local_1b0;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar12->m_backend).data._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
      pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar10 + ((ulong)bVar14 * -2 + 1) * 4);
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + ((ulong)bVar14 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = epsilon.m_backend.exp;
    local_1b0.m_backend.neg = epsilon.m_backend.neg;
    local_1b0.m_backend.fpclass = epsilon.m_backend.fpclass;
    local_1b0.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    piVar1 = (x->super_IdxSet).idx;
    pnVar10 = (x->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    x->setupStatus = false;
    pnVar12 = (this->ssvec).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar2 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar11 = &epsilon;
    puVar13 = local_230;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      *puVar13 = (pnVar11->m_backend).data._M_elems[0];
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + ((ulong)bVar14 * -2 + 1) * 4);
      puVar13 = puVar13 + (ulong)bVar14 * -2 + 1;
    }
    local_1c0 = epsilon.m_backend.exp;
    local_1bc = epsilon.m_backend.neg;
    local_1b8 = epsilon.m_backend.fpclass;
    local_1b4 = epsilon.m_backend.prec_elem;
    rhs->setupStatus = false;
    pnVar3 = (rhs->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar4 = (this->forest).super_IdxSet.idx;
    pnVar5 = (this->forest).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (this->forest).setupStatus = false;
    eps2.m_backend.data._M_elems._8_8_ = pnVar3;
    eps2.m_backend.data._M_elems._0_8_ = local_230;
    eps2.m_backend.data._M_elems._16_8_ = piVar15;
    eps2.m_backend.data._M_elems[6] = (int)uVar8;
    eps2.m_backend.data._M_elems[7] = (int)(uVar8 >> 0x20);
    eps2.m_backend.data._M_elems._32_8_ = pnVar5;
    eps2.m_backend.data._M_elems._40_8_ = &f;
    eps2.m_backend.data._M_elems._48_8_ = piVar4;
    eps2.m_backend.data._M_elems[0xe] = 0x1c;
    eps2.m_backend.data._M_elems[0xf] = 0;
    eps2.m_backend.data._M_elems[0x10] = iVar7;
    eps2.m_backend.data._M_elems[0x11] = 0;
    eps2.m_backend.data._M_elems._72_8_ = piVar1;
    eps2.m_backend.data._M_elems._80_8_ = pnVar2;
    eps2.m_backend.data._M_elems._88_8_ = this_00;
    eps2.m_backend.data._M_elems._96_8_ = ridx;
    eps2.m_backend.data._M_elems[0x1a] = (int)uVar8;
    eps2.m_backend.data._M_elems[0x1b] = (int)(uVar8 >> 0x20);
    eps2.m_backend._112_8_ = piVar15;
    eps2.m_backend._120_8_ = pnVar10;
    iVar7 = CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::vSolveRight4update2
                      (this_00,&local_1b0,pnVar10,piVar1,pnVar12,ridx,iVar7,pnVar2,eps2,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(f,uStack_2c8),(int *)in_stack_fffffffffffffd40,
                       in_stack_fffffffffffffd48,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)epsilon.m_backend.data._M_elems._0_8_,
                       (int *)epsilon.m_backend.data._M_elems._8_8_,
                       (int *)epsilon.m_backend.data._M_elems._16_8_);
    (x->super_IdxSet).num = iVar7;
    x->setupStatus = true;
    (this->forest).super_IdxSet.num = f;
    (this->forest).setupStatus = true;
  }
  rhs->setupStatus = true;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  this->solveCount = this->solveCount + 2;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solve2right4update(
   SSVectorBase<R>&       x,
   VectorBase<R>&        y,
   const SVectorBase<R>& b,
   SSVectorBase<R>&       rhs)
{

   solveTime->start();

   int  m;
   int  n;
   int  f;
   int* sidx = ssvec.altIndexMem();
   ssvec.setSize(0);
   ssvec.forceSetup();
   int  rsize = rhs.size();
   int* ridx = rhs.altIndexMem();
   R epsilon = this->tolerances()->epsilon();

   x.clear();
   y.clear();
   usetup = true;
   ssvec = b;

   if(this->l.updateType == ETA)
   {
      n = ssvec.size();
      m = this->vSolveRight4update2(epsilon, x.altValues(), x.altIndexMem(),
                                    ssvec.get_ptr(), sidx, n, y.get_ptr(),
                                    epsilon, rhs.altValues(), ridx, rsize, nullptr, nullptr, nullptr);
      x.setSize(m);
      //      x.forceSetup();
      x.unSetup();
      eta.setup_and_assign(x);
   }
   else
   {
      forest.clear();
      n = ssvec.size();
      m = this->vSolveRight4update2(epsilon, x.altValues(), x.altIndexMem(),
                                    ssvec.get_ptr(), sidx, n, y.get_ptr(),
                                    epsilon, rhs.altValues(), ridx, rsize,
                                    forest.altValues(), &f, forest.altIndexMem());
      x.setSize(m);
      x.forceSetup();
      forest.setSize(f);
      forest.forceSetup();
   }

   rhs.forceSetup();
   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount += 2;
   solveTime->stop();
}